

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void deqp::gls::BuiltinPrecisionTests::
     addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Clamp>
               (BuiltinFuncs *funcs,string *name)

{
  deInt32 *pdVar1;
  Clamp *pCVar2;
  CaseFactory *pCVar3;
  value_type local_48;
  CaseFactory *local_38;
  _func_int **pp_Stack_30;
  CaseFactory local_28;
  _func_int **pp_Stack_20;
  
  if (name->_M_string_length == 0) {
    pCVar2 = instance<deqp::gls::BuiltinPrecisionTests::Functions::Clamp>();
    (**(code **)((long)*pCVar2 + 0x10))((string *)&local_38,pCVar2);
    std::__cxx11::string::operator=((string *)name,(string *)&local_38);
    if (local_38 != &local_28) {
      operator_delete(local_38,(long)local_28._vptr_CaseFactory + 1);
    }
  }
  pCVar3 = (CaseFactory *)operator_new(0x48);
  makeVectorizedFuncs<deqp::gls::BuiltinPrecisionTests::Functions::Clamp>();
  pCVar3->_vptr_CaseFactory = (_func_int **)&PTR__GenFuncCaseFactory_00d52408;
  pCVar3[1]._vptr_CaseFactory = (_func_int **)local_38;
  pCVar3[2]._vptr_CaseFactory = pp_Stack_30;
  pCVar3[3]._vptr_CaseFactory = local_28._vptr_CaseFactory;
  pCVar3[4]._vptr_CaseFactory = pp_Stack_20;
  de::toLower((string *)(pCVar3 + 5),name);
  local_48.m_state = (SharedPtrStateBase *)0x0;
  local_48.m_ptr = pCVar3;
  local_48.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_48.m_state)->strongRefCount = 0;
  (local_48.m_state)->weakRefCount = 0;
  (local_48.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d52a08;
  local_48.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pCVar3;
  (local_48.m_state)->strongRefCount = 1;
  (local_48.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(&funcs->m_factories,&local_48);
  if (local_48.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_48.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_48.m_ptr = (CaseFactory *)0x0;
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_48.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_48.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

void addScalarFactory(BuiltinFuncs& funcs, string name = "")
{
	if (name.empty())
		name = instance<F>().getName();

	funcs.addFactory(SharedPtr<const CaseFactory>(new GenFuncCaseFactory<typename F::Sig>(
													  makeVectorizedFuncs<F>(), name)));
}